

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXMeshGeometry.cpp
# Opt level: O1

void __thiscall
Assimp::FBX::ShapeGeometry::ShapeGeometry
          (ShapeGeometry *this,uint64_t id,Element *element,string *name,Document *doc)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Scope *sc;
  Element *el;
  Element *el_00;
  Element *el_01;
  string local_68;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *local_48;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *local_40;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_38;
  
  Geometry::Geometry(&this->super_Geometry,id,element,name,doc);
  (this->super_Geometry).super_Object._vptr_Object = (_func_int **)&PTR__ShapeGeometry_00259c20;
  local_40 = &this->m_vertices;
  local_48 = &this->m_normals;
  local_38 = &this->m_indices;
  (this->m_vertices).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_vertices).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_vertices).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_normals).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_normals).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_normals).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_indices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_indices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_indices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  sc = (element->compound)._M_t.
       super___uniq_ptr_impl<Assimp::FBX::Scope,_std::default_delete<Assimp::FBX::Scope>_>._M_t.
       super__Tuple_impl<0UL,_Assimp::FBX::Scope_*,_std::default_delete<Assimp::FBX::Scope>_>.
       super__Head_base<0UL,_Assimp::FBX::Scope_*,_false>._M_head_impl;
  paVar1 = &local_68.field_2;
  local_68._M_dataplus._M_p = (pointer)paVar1;
  if (sc != (Scope *)0x0) {
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"Indexes","");
    el = GetRequiredElement(sc,&local_68,element);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != paVar1) {
      operator_delete(local_68._M_dataplus._M_p);
    }
    local_68._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"Normals","");
    el_00 = GetRequiredElement(sc,&local_68,element);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != paVar1) {
      operator_delete(local_68._M_dataplus._M_p);
    }
    local_68._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"Vertices","");
    el_01 = GetRequiredElement(sc,&local_68,element);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != paVar1) {
      operator_delete(local_68._M_dataplus._M_p);
    }
    ParseVectorDataArray(local_38,el);
    ParseVectorDataArray(local_40,el_01);
    ParseVectorDataArray(local_48,el_00);
    return;
  }
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_68,
             "failed to read Geometry object (class: Shape), no data scope found","");
  Util::DOMError(&local_68,(Element *)0x0);
}

Assistant:

ShapeGeometry::ShapeGeometry(uint64_t id, const Element& element, const std::string& name, const Document& doc)
: Geometry(id, element, name, doc) {
    const Scope *sc = element.Compound();
    if (nullptr == sc) {
        DOMError("failed to read Geometry object (class: Shape), no data scope found");
    }
    const Element& Indexes = GetRequiredElement(*sc, "Indexes", &element);
    const Element& Normals = GetRequiredElement(*sc, "Normals", &element);
    const Element& Vertices = GetRequiredElement(*sc, "Vertices", &element);
    ParseVectorDataArray(m_indices, Indexes);
    ParseVectorDataArray(m_vertices, Vertices);
    ParseVectorDataArray(m_normals, Normals);
}